

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

void QuaternionToAxisAngle(Quaternion q,Vector3 *outAxis,float *outAngle)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  undefined1 extraout_var [12];
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float local_38;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 auVar5 [16];
  undefined4 uVar6;
  
  local_38 = q.z;
  fVar9 = q.w;
  fStack_20 = q.x;
  fStack_1c = q.y;
  local_28 = q.x;
  fStack_24 = q.y;
  if (1.0 < ABS(fVar9)) {
    fVar8 = SQRT(fVar9 * fVar9 + local_38 * local_38 + local_28 * local_28 + fStack_24 * fStack_24);
    uVar2 = -(uint)(fVar8 == 0.0);
    fVar8 = (float)(uVar2 & 0x3f800000 | ~uVar2 & (uint)(1.0 / fVar8));
    local_28 = local_28 * fVar8;
    fStack_24 = fStack_24 * fVar8;
    fStack_20 = fStack_20 * fVar8;
    fStack_1c = fStack_1c * fVar8;
    local_38 = local_38 * fVar8;
    fVar9 = fVar9 * fVar8;
  }
  fVar8 = acosf(fVar9);
  fVar9 = 1.0 - fVar9 * fVar9;
  if (fVar9 < 0.0) {
    auVar7._0_4_ = sqrtf(fVar9);
    auVar7._4_12_ = extraout_var;
    uVar3 = auVar7._0_8_;
  }
  else {
    uVar3 = (ulong)(uint)SQRT(fVar9);
  }
  fVar9 = 0.0;
  auVar4._0_4_ = (float)uVar3;
  auVar1._4_4_ = fStack_24;
  auVar1._0_4_ = local_28;
  auVar1._8_4_ = fStack_20;
  auVar1._12_4_ = fStack_1c;
  if (0.0001 < auVar4._0_4_) {
    fVar9 = local_38 / auVar4._0_4_;
  }
  uVar6 = (undefined4)(uVar3 >> 0x20);
  auVar5._8_4_ = uVar6;
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = uVar6;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar7 = divps(auVar1,auVar4);
  uVar2 = (int)((uint)(0.0001 < auVar4._0_4_) << 0x1f) >> 0x1f;
  uVar3 = (ulong)(~uVar2 & 0x3f800000) |
          CONCAT44(auVar7._4_4_ & (int)((uint)(0.0001 < auVar4._0_4_) << 0x1f) >> 0x1f,
                   auVar7._0_4_ & uVar2);
  outAxis->x = (float)(int)uVar3;
  outAxis->y = (float)(int)(uVar3 >> 0x20);
  outAxis->z = fVar9;
  *outAngle = fVar8 + fVar8;
  return;
}

Assistant:

RMDEF void QuaternionToAxisAngle(Quaternion q, Vector3 *outAxis, float *outAngle)
{
    if (fabs(q.w) > 1.0f) q = QuaternionNormalize(q);

    Vector3 resAxis = { 0.0f, 0.0f, 0.0f };
    float resAngle = 2.0f*acosf(q.w);
    float den = sqrtf(1.0f - q.w*q.w);

    if (den > 0.0001f)
    {
        resAxis.x = q.x/den;
        resAxis.y = q.y/den;
        resAxis.z = q.z/den;
    }
    else
    {
        // This occurs when the angle is zero.
        // Not a problem: just set an arbitrary normalized axis.
        resAxis.x = 1.0f;
    }

    *outAxis = resAxis;
    *outAngle = resAngle;
}